

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O3

void __thiscall MD5::encodeFile(MD5 *this,char *filename,qpdf_offset_t up_to_offset)

{
  element_type *peVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  size_t sVar4;
  uchar *puVar5;
  long *plVar6;
  size_type *psVar7;
  size_t __n;
  ulong uVar8;
  char buffer [1024];
  string local_478;
  long *local_458 [2];
  long local_448 [2];
  char local_438 [1032];
  
  __stream = (FILE *)QUtil::safe_fopen(filename,"rb");
  uVar8 = 0;
  uVar3 = 0;
  if (-1 < up_to_offset) {
    uVar3 = up_to_offset;
  }
  sVar4 = 0x400;
  do {
    __n = uVar3 - uVar8;
    if (uVar8 + sVar4 <= uVar3) {
      __n = sVar4;
    }
    if (up_to_offset < 0) {
      __n = sVar4;
    }
    sVar4 = fread(local_438,1,__n,__stream);
    if (sVar4 == 0) break;
    peVar1 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar5 = QUtil::unsigned_char_pointer(local_438);
    (*peVar1->_vptr_QPDFCryptoImpl[4])(peVar1,puVar5,sVar4);
    uVar8 = uVar8 + sVar4;
    sVar4 = __n;
  } while ((up_to_offset < 0) || (uVar8 < uVar3));
  iVar2 = ferror(__stream);
  if (iVar2 != 0) {
    fclose(__stream);
    local_458[0] = local_448;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"MD5: read error on ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_458);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_478.field_2._M_allocated_capacity = *psVar7;
      local_478.field_2._8_8_ = plVar6[3];
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    }
    else {
      local_478.field_2._M_allocated_capacity = *psVar7;
      local_478._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_478._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    QUtil::throw_system_error(&local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if (local_458[0] != local_448) {
      operator_delete(local_458[0],local_448[0] + 1);
    }
  }
  fclose(__stream);
  (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[5])();
  return;
}

Assistant:

void
MD5::encodeFile(char const* filename, qpdf_offset_t up_to_offset)
{
    char buffer[1024];

    FILE* file = QUtil::safe_fopen(filename, "rb");
    size_t len;
    size_t so_far = 0;
    size_t to_try = 1024;
    size_t up_to_size = 0;
    if (up_to_offset >= 0) {
        up_to_size = QIntC::to_size(up_to_offset);
    }
    do {
        if ((up_to_offset >= 0) && ((so_far + to_try) > up_to_size)) {
            to_try = up_to_size - so_far;
        }
        len = fread(buffer, 1, to_try, file);
        if (len > 0) {
            encodeDataIncrementally(buffer, len);
            so_far += len;
            if ((up_to_offset >= 0) && (so_far >= up_to_size)) {
                break;
            }
        }
    } while (len > 0);
    if (ferror(file)) {
        // Assume, perhaps incorrectly, that errno was set by the underlying call to read....
        (void)fclose(file);
        QUtil::throw_system_error(std::string("MD5: read error on ") + filename);
    }
    (void)fclose(file);

    this->crypto->MD5_finalize();
}